

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::Clara::Opt::parse
          (InternalParseResult *__return_storage_ptr__,Opt *this,string *param_1,TokenStream *tokens
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  char *pcVar3;
  char *pcVar4;
  element_type *peVar5;
  pointer pTVar6;
  pointer pTVar7;
  StringRef *pSVar8;
  bool bVar9;
  int iVar10;
  size_type in_R9;
  StringRef lhs;
  StringRef lhs_00;
  StringRef rhs;
  StringRef rhs_00;
  ParserResult result;
  Result validationResult;
  undefined1 local_b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  long *local_80 [2];
  long local_70 [2];
  BasicResult<void> local_60;
  
  (*(this->super_ParserRefImpl<Catch::Clara::Opt>).super_ComposableParserImpl<Catch::Clara::Opt>.
    super_ParserBase._vptr_ParserBase[2])(&local_60);
  if (local_60.super_ResultValueBase<void>.super_ResultBase.m_type != Ok) {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&local_60);
    goto LAB_00143f67;
  }
  pTVar2 = (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((pTVar2 != (tokens->m_tokenBuffer).
                  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                  ._M_impl.super__Vector_impl_data._M_finish) ||
      ((tokens->it)._M_current != (tokens->itEnd)._M_current)) && (pTVar2->type == Option)) {
    pcVar3 = (pTVar2->token).m_start;
    pcVar4 = (char *)(pTVar2->token).m_size;
    bVar9 = isMatch(this,pTVar2->token);
    if (bVar9) {
      iVar10 = (*((this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
                  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_vptr_BoundRef[3])();
      peVar5 = (this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if ((char)iVar10 == '\0') {
        Detail::TokenStream::operator++(tokens);
        pTVar2 = (tokens->m_tokenBuffer).
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pTVar2 == (tokens->m_tokenBuffer).
                       super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                       ._M_impl.super__Vector_impl_data._M_finish) &&
           ((tokens->it)._M_current == (tokens->itEnd)._M_current)) {
          lhs.m_size = (size_type)pcVar3;
          lhs.m_start = (char *)0x1c;
          rhs.m_size = in_R9;
          rhs.m_start = pcVar4;
          operator+[abi_cxx11_((string *)local_b0,(Catch *)"Expected argument following ",lhs,rhs);
        }
        else {
          if (pTVar2->type == Argument) {
            pcVar3 = (pTVar2->token).m_start;
            local_80[0] = local_70;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_80,pcVar3,pcVar3 + (pTVar2->token).m_size);
            (*peVar5->_vptr_BoundRef[4])(local_b0,peVar5,local_80);
            if (local_80[0] != local_70) {
              operator_delete(local_80[0],local_70[0] + 1);
            }
            if (local_b0._8_4_ == Ok) {
              (**(_func_int **)(local_b0._0_8_ + 0x10))();
              if (local_b0._12_4_ == ShortCircuitAll) {
                (**(_func_int **)(local_b0._0_8_ + 0x10))();
                goto LAB_00143d75;
              }
              goto LAB_00143e88;
            }
            Detail::BasicResult<Catch::Clara::Detail::ParseState>::
            BasicResult<Catch::Clara::ParseResultType>
                      (__return_storage_ptr__,(BasicResult<Catch::Clara::ParseResultType> *)local_b0
                      );
            goto LAB_00143dcd;
          }
          lhs_00.m_size = (size_type)pcVar3;
          lhs_00.m_start = (char *)0x1c;
          rhs_00.m_size = in_R9;
          rhs_00.m_start = pcVar4;
          operator+[abi_cxx11_
                    ((string *)local_b0,(Catch *)"Expected argument following ",lhs_00,rhs_00);
        }
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase.m_type = RuntimeError;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
        paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
        if ((undefined1 *)local_b0._0_8_ == local_b0 + 0x10) {
          paVar1->_M_allocated_capacity = local_b0._16_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
               local_b0._24_8_;
        }
        else {
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)local_b0._0_8_;
          (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = local_b0._16_8_;
        }
        (__return_storage_ptr__->m_errorMessage)._M_string_length =
             CONCAT44(local_b0._12_4_,local_b0._8_4_);
      }
      else {
        (*peVar5->_vptr_BoundRef[4])(local_b0,peVar5,1);
        if (local_b0._8_4_ == Ok) {
          (**(_func_int **)(local_b0._0_8_ + 0x10))();
          if (local_b0._12_4_ != ShortCircuitAll) {
LAB_00143e88:
            local_b0._0_8_ = &PTR__BasicResult_001b2540;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._16_8_ != &local_90) {
              operator_delete((void *)local_b0._16_8_,local_90._M_allocated_capacity + 1);
            }
            Detail::TokenStream::operator++(tokens);
            pTVar2 = (tokens->m_tokenBuffer).
                     super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pTVar6 = (tokens->m_tokenBuffer).
                     super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pTVar7 = (tokens->m_tokenBuffer).
                     super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            (tokens->m_tokenBuffer).
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (tokens->m_tokenBuffer).
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (tokens->m_tokenBuffer).
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
            super_ResultBase.m_type = Ok;
            (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
            super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001b24a8;
            (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
            field_0.m_value.m_type = Matched;
            pSVar8 = (tokens->itEnd)._M_current;
            (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
            field_0.m_value.m_remainingTokens.it._M_current = (tokens->it)._M_current;
            (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
            field_0.m_value.m_remainingTokens.itEnd._M_current = pSVar8;
            (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
            field_0.m_value.m_remainingTokens.m_tokenBuffer.
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_start = pTVar6;
            (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
            field_0.m_value.m_remainingTokens.m_tokenBuffer.
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_finish = pTVar7;
            (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
            field_0.m_value.m_remainingTokens.m_tokenBuffer.
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar2;
            (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
            super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
            (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
            (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
            (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
            goto LAB_00143f0b;
          }
          (**(_func_int **)(local_b0._0_8_ + 0x10))();
LAB_00143d75:
          pTVar2 = (tokens->m_tokenBuffer).
                   super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pTVar6 = (tokens->m_tokenBuffer).
                   super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pTVar7 = (tokens->m_tokenBuffer).
                   super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          (tokens->m_tokenBuffer).
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (tokens->m_tokenBuffer).
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (tokens->m_tokenBuffer).
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
          super_ResultBase.m_type = Ok;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
          super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001b24a8;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
          m_value.m_type = local_b0._12_4_;
          pSVar8 = (tokens->itEnd)._M_current;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
          m_value.m_remainingTokens.it._M_current = (tokens->it)._M_current;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
          m_value.m_remainingTokens.itEnd._M_current = pSVar8;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
          m_value.m_remainingTokens.m_tokenBuffer.
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_start = pTVar6;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
          m_value.m_remainingTokens.m_tokenBuffer.
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_finish = pTVar7;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
          m_value.m_remainingTokens.m_tokenBuffer.
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar2;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
          super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
          (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
          (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
        }
        else {
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::
          BasicResult<Catch::Clara::ParseResultType>
                    (__return_storage_ptr__,(BasicResult<Catch::Clara::ParseResultType> *)local_b0);
        }
LAB_00143dcd:
        local_b0._0_8_ = &PTR__BasicResult_001b2540;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._16_8_ != &local_90) {
          operator_delete((void *)local_b0._16_8_,local_90._M_allocated_capacity + 1);
        }
      }
LAB_00143f0b:
      if (bVar9) goto LAB_00143f67;
    }
  }
  pTVar2 = (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pTVar6 = (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar7 = (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  .m_type = Ok;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001b24a8;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_type = NoMatch;
  pSVar8 = (tokens->itEnd)._M_current;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_remainingTokens.it._M_current = (tokens->it)._M_current;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_remainingTokens.itEnd._M_current = pSVar8;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_remainingTokens.m_tokenBuffer.
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = pTVar6;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_remainingTokens.m_tokenBuffer.
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = pTVar7;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_remainingTokens.m_tokenBuffer.
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar2;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_00143f67:
  local_60.super_ResultValueBase<void>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001b25c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_errorMessage._M_dataplus._M_p != &local_60.m_errorMessage.field_2) {
    operator_delete(local_60.m_errorMessage._M_dataplus._M_p,
                    local_60.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult Opt::parse(std::string const&,
                                       Detail::TokenStream tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            if (tokens &&
                tokens->type == Detail::TokenType::Option) {
                auto const& token = *tokens;
                if (isMatch(token.token)) {
                    if (m_ref->isFlag()) {
                        auto flagRef =
                            static_cast<Detail::BoundFlagRefBase*>(
                                m_ref.get());
                        auto result = flagRef->setFlag(true);
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), CATCH_MOVE(tokens)));
                    } else {
                        auto valueRef =
                            static_cast<Detail::BoundValueRefBase*>(
                                m_ref.get());
                        ++tokens;
                        if (!tokens)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        auto const& argToken = *tokens;
                        if (argToken.type != Detail::TokenType::Argument)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        const auto result = valueRef->setValue(static_cast<std::string>(argToken.token));
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), CATCH_MOVE(tokens)));
                    }
                    return Detail::InternalParseResult::ok(Detail::ParseState(
                        ParseResultType::Matched, CATCH_MOVE(++tokens)));
                }
            }
            return Detail::InternalParseResult::ok(
                Detail::ParseState(ParseResultType::NoMatch, CATCH_MOVE(tokens)));
        }